

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::TemplatedRadixScatter<duckdb::uhugeint_t>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  ulong *puVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t i;
  idx_t iVar9;
  undefined3 in_register_00000089;
  idx_t iVar10;
  long lVar11;
  
  pdVar1 = vdata->data;
  if (CONCAT31(in_register_00000089,has_null) == 0) {
    for (uVar7 = 0; uVar7 != add_count; uVar7 = uVar7 + 1) {
      uVar8 = uVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)sel->sel_vector[uVar7];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar2[uVar8];
      }
      puVar4 = (ulong *)key_locations[uVar7];
      uVar5 = *(ulong *)(pdVar1 + uVar8 * 0x10 + offset * 0x10);
      uVar8 = *(ulong *)(pdVar1 + uVar8 * 0x10 + offset * 0x10 + 8);
      *puVar4 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
      puVar4[1] = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                  (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                  (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                  | uVar5 << 0x38;
      if (desc) {
        for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
          key_locations[uVar7][lVar11] = ~key_locations[uVar7][lVar11];
        }
      }
      key_locations[uVar7] = key_locations[uVar7] + 0x10;
    }
  }
  else {
    for (iVar9 = 0; iVar9 != add_count; iVar9 = iVar9 + 1) {
      iVar10 = iVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)sel->sel_vector[iVar9];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar10 = (idx_t)psVar2[iVar10];
      }
      bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,
                         iVar10 + offset);
      if (bVar6) {
        *key_locations[iVar9] = nulls_first;
        pdVar3 = key_locations[iVar9];
        lVar11 = (iVar10 + offset) * 0x10;
        uVar7 = *(ulong *)(pdVar1 + lVar11);
        uVar8 = *(ulong *)(pdVar1 + lVar11 + 8);
        *(ulong *)(pdVar3 + 1) =
             uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
             (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
             (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
        *(ulong *)(pdVar3 + 9) =
             uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
             (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
             (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
        if (desc) {
          for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
            key_locations[iVar9][lVar11 + 1] = ~key_locations[iVar9][lVar11 + 1];
          }
        }
      }
      else {
        *key_locations[iVar9] = !nulls_first;
        pdVar3 = key_locations[iVar9];
        pdVar3[1] = '\0';
        pdVar3[2] = '\0';
        pdVar3[3] = '\0';
        pdVar3[4] = '\0';
        pdVar3[5] = '\0';
        pdVar3[6] = '\0';
        pdVar3[7] = '\0';
        pdVar3[8] = '\0';
        pdVar3[9] = '\0';
        pdVar3[10] = '\0';
        pdVar3[0xb] = '\0';
        pdVar3[0xc] = '\0';
        pdVar3[0xd] = '\0';
        pdVar3[0xe] = '\0';
        pdVar3[0xf] = '\0';
        pdVar3[0x10] = '\0';
      }
      key_locations[iVar9] = key_locations[iVar9] + 0x11;
    }
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}